

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O3

void __thiscall rcg::Stream::startStreaming(Stream *this,int nacquire,int min_buffers)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  GC_ERROR GVar4;
  long lVar5;
  long *plVar6;
  size_t sVar7;
  size_t sVar8;
  ICommand *pIVar9;
  GenTLException *pGVar10;
  uint64_t uVar11;
  ulong uVar12;
  CCommandPtr start;
  BUFFER_HANDLE pp;
  shared_ptr<GenApi_3_4::CNodeMapRef> nmap;
  CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> local_b0;
  string local_a0 [2];
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 == 0) {
    Buffer::setHandle(&this->buffer,(void *)0x0);
    if (this->stream != (void *)0x0) {
      if (this->bn != 0) {
        stopStreaming(this);
      }
      Device::getRemoteNodeMap
                ((Device *)local_50,
                 (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      uVar1 = local_50._0_8_;
      GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,"TLParamsLocked");
      lVar5 = (*(code *)(((((enable_shared_from_this<rcg::Device> *)uVar1)->_M_weak_this).
                          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id).
                        _M_string_length)(uVar1,local_a0);
      if (lVar5 == 0) {
        GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
      }
      else {
        plVar6 = (long *)__dynamic_cast(lVar5,&GenApi_3_4::INode::typeinfo,
                                        &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
        GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
        if ((plVar6 != (long *)0x0) &&
           ((iVar3 = (*(code *)**(undefined8 **)((long)plVar6 + *(long *)(*plVar6 + -0x28)))
                               ((long)plVar6 + *(long *)(*plVar6 + -0x28)), iVar3 == 4 ||
            (iVar3 == 2)))) {
          (**(code **)(*plVar6 + 0x38))(plVar6,1,1);
        }
      }
      bVar2 = getDefinesPayloadsize(this);
      uVar1 = local_50._0_8_;
      if (bVar2) {
        sVar7 = getPayloadSize(this);
      }
      else {
        GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,"PayloadSize");
        lVar5 = (*(code *)(((((enable_shared_from_this<rcg::Device> *)uVar1)->_M_weak_this).
                            super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id).
                          _M_string_length)(uVar1,local_a0);
        if (lVar5 == 0) {
          GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
        }
        else {
          plVar6 = (long *)__dynamic_cast(lVar5,&GenApi_3_4::INode::typeinfo,
                                          &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
          GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
          if ((plVar6 != (long *)0x0) &&
             (iVar3 = (*(code *)**(undefined8 **)((long)plVar6 + *(long *)(*plVar6 + -0x28)))
                                ((long)plVar6 + *(long *)(*plVar6 + -0x28)), iVar3 - 3U < 2)) {
            sVar7 = (**(code **)(*plVar6 + 0x48))(plVar6,0,0);
            goto LAB_001154dd;
          }
        }
        sVar7 = 0;
      }
LAB_001154dd:
      sVar8 = getBufAnnounceMin(this);
      uVar12 = (long)min_buffers;
      if ((ulong)(long)min_buffers < sVar8) {
        uVar12 = sVar8;
      }
      this->bn = uVar12;
      if (uVar12 != 0) {
        uVar12 = 0;
        do {
          local_a0[0]._M_dataplus._M_p = (pointer)0x0;
          GVar4 = (*((this->gentl).
                     super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->DSAllocAndAnnounceBuffer)
                            (this->stream,sVar7,(void *)0x0,(BUFFER_HANDLE *)local_a0);
          if ((GVar4 != 0) ||
             (GVar4 = (*((this->gentl).
                         super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->DSQueueBuffer)(this->stream,local_a0[0]._M_dataplus._M_p),
             GVar4 != 0)) goto LAB_001156f4;
          uVar12 = uVar12 + 1;
        } while (uVar12 < this->bn);
      }
      GVar4 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                GCRegisterEvent)(this->stream,1,&this->event);
      if (GVar4 == 0) {
        uVar11 = 0xffffffffffffffff;
        if (0 < nacquire) {
          uVar11 = (ulong)(uint)nacquire;
        }
        GVar4 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSStartAcquisition)(this->stream,0,uVar11);
        if (GVar4 == 0) {
          Device::getRemoteNodeMap
                    ((Device *)(local_50 + 0x10),
                     (char *)(this->parent).
                             super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,"AcquisitionStart");
          plVar6 = (long *)(*(code *)(((((enable_shared_from_this<rcg::Interface> *)local_50._16_8_)
                                       ->_M_weak_this).
                                       super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->id)._M_string_length)(local_50._16_8_,local_a0);
          if (plVar6 == (long *)0x0) {
            local_b0._vptr_CPointer = (_func_int **)&PTR__CPointer_00137688;
            local_b0.m_pT = (ICommand *)0x0;
          }
          else {
            local_b0._vptr_CPointer = (_func_int **)&PTR__CPointer_00137688;
            local_b0.m_pT =
                 (ICommand *)
                 __dynamic_cast((long)plVar6 + *(long *)(*plVar6 + -0x28),
                                &GenApi_3_4::IBase::typeinfo,&GenApi_3_4::ICommand::typeinfo,
                                0xffffffffffffffff);
          }
          GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
          if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
          }
          pIVar9 = GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->
                             (&local_b0);
          (**(code **)(*(long *)pIVar9 + 0x38))(pIVar9,1);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
          return;
        }
        (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->GCUnregisterEvent)(this->stream,1);
      }
LAB_001156f4:
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSFlushQueue)(this->stream,4);
      local_b0._vptr_CPointer = (_func_int **)0x0;
      while (GVar4 = (*((this->gentl).
                        super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->DSGetBufferID)(this->stream,0,&local_b0._vptr_CPointer), GVar4 == 0)
      {
        (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->DSRevokeBuffer)(this->stream,local_b0._vptr_CPointer,(void **)0x0,(void **)0x0);
      }
      GenICam_3_4::gcstring::gcstring((gcstring *)local_a0,"TLParamsLocked");
      lVar5 = (*(code *)(((((enable_shared_from_this<rcg::Device> *)local_50._0_8_)->_M_weak_this).
                          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id).
                        _M_string_length)(local_50._0_8_,local_a0);
      if (lVar5 == 0) {
        GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
      }
      else {
        plVar6 = (long *)__dynamic_cast(lVar5,&GenApi_3_4::INode::typeinfo,
                                        &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
        GenICam_3_4::gcstring::~gcstring((gcstring *)local_a0);
        if ((plVar6 != (long *)0x0) &&
           ((iVar3 = (*(code *)**(undefined8 **)((long)plVar6 + *(long *)(*plVar6 + -0x28)))
                               ((long)plVar6 + *(long *)(*plVar6 + -0x28)), iVar3 == 4 ||
            (iVar3 == 2)))) {
          (**(code **)(*plVar6 + 0x38))(plVar6,0,1);
        }
      }
      pGVar10 = (GenTLException *)__cxa_allocate_exception(0x28);
      local_a0[0]._M_dataplus._M_p = (pointer)&local_a0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Stream::startStreaming()","");
      GenTLException::GenTLException(pGVar10,local_a0,&this->gentl);
      __cxa_throw(pGVar10,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
  }
  else {
    std::__throw_system_error(iVar3);
  }
  pGVar10 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_a0[0]._M_dataplus._M_p = (pointer)&local_a0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"Stream::startStreaming(): Stream is not open","");
  GenTLException::GenTLException(pGVar10,local_a0);
  __cxa_throw(pGVar10,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void Stream::startStreaming(int nacquire, int min_buffers)
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  buffer.setHandle(0);

  if (stream == 0)
  {
    throw GenTLException("Stream::startStreaming(): Stream is not open");
  }

  // stop streaming if it is currently running

  if (bn > 0)
  {
    stopStreaming();
  }

  // lock parameters before streaming starts

  std::shared_ptr<GenApi::CNodeMapRef> nmap=parent->getRemoteNodeMap();
  GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

  if (GenApi::IsWritable(p))
  {
    p->SetValue(1);
  }

  // determine maximum buffer size from transport layer or remote device

  size_t size=0;
  if (getDefinesPayloadsize())
  {
    size=getPayloadSize();
  }
  else
  {
    GenApi::IInteger *pp=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("PayloadSize"));

    if (GenApi::IsReadable(pp))
    {
      size=static_cast<size_t>(pp->GetValue());
    }
  }

  // announce and queue the minimum number of buffers

  bool err=false;

  bn=std::max(static_cast<size_t>(min_buffers), getBufAnnounceMin());
  for (size_t i=0; i<bn; i++)
  {
    GenTL::BUFFER_HANDLE pp=0;

    if (gentl->DSAllocAndAnnounceBuffer(stream, size, 0, &pp) != GenTL::GC_ERR_SUCCESS)
    {
      err=true;
      break;
    }

    if (!err && gentl->DSQueueBuffer(stream, pp) != GenTL::GC_ERR_SUCCESS)
    {
      err=true;
      break;
    }
  }

  // register event

  if (!err && gentl->GCRegisterEvent(stream, GenTL::EVENT_NEW_BUFFER, &event) !=
      GenTL::GC_ERR_SUCCESS)
  {
    err=true;
  }

  // start streaming

  uint64_t n=GENTL_INFINITE;

  if (nacquire > 0)
  {
    n=static_cast<uint64_t>(nacquire);
  }

  if (!err && gentl->DSStartAcquisition(stream, GenTL::ACQ_START_FLAGS_DEFAULT, n) !=
      GenTL::GC_ERR_SUCCESS)
  {
    gentl->GCUnregisterEvent(stream, GenTL::EVENT_NEW_BUFFER);
    err=true;
  }

  if (!err)
  {
    GenApi::CCommandPtr start=parent->getRemoteNodeMap()->_GetNode("AcquisitionStart");
    start->Execute();
  }

  // revoke buffers in case of an error, before throwing an event

  if (err)
  {
    gentl->DSFlushQueue(stream, GenTL::ACQ_QUEUE_ALL_DISCARD);

    GenTL::BUFFER_HANDLE pp=0;
    while (gentl->DSGetBufferID(stream, 0, &pp) == GenTL::GC_ERR_SUCCESS)
    {
      gentl->DSRevokeBuffer(stream, pp, 0, 0);
    }

    // unlock parameters

    GenApi::IInteger *pi=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

    if (GenApi::IsWritable(pi))
    {
      pi->SetValue(0);
    }

    throw GenTLException("Stream::startStreaming()", gentl);
  }
}